

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O2

void luaH_resize(lua_State *L,Table *t,uint nasize,uint nhsize)

{
  ushort uVar1;
  Node *block;
  GCObject *pGVar2;
  int iVar3;
  TValue *pTVar4;
  TValue *pTVar5;
  uint uVar6;
  ulong key;
  long lVar7;
  ulong uVar8;
  uint local_4c;
  AuxsetnodeT asn;
  
  uVar6 = t->sizearray;
  if (t->lastfree == (Node *)0x0) {
    local_4c = 0;
  }
  else {
    local_4c = 1 << (t->lsizenode & 0x1f);
  }
  block = t->node;
  if (uVar6 < nasize) {
    setarrayvector(L,t,nasize);
  }
  asn.t = t;
  asn.nhsize = nhsize;
  iVar3 = luaD_rawrunprotected(L,auxsetnode,&asn);
  if (iVar3 == 0) {
    if (nasize < uVar6) {
      uVar8 = (ulong)nasize;
      lVar7 = uVar8 << 4;
      t->sizearray = nasize;
      key = uVar8;
      while (pTVar4 = t->array, key < uVar6) {
        key = key + 1;
        if (*(short *)((long)&pTVar4->tt_ + lVar7) != 0) {
          luaH_setint(L,t,key,(TValue *)((long)&pTVar4->value_ + lVar7));
        }
        lVar7 = lVar7 + 0x10;
      }
      pTVar4 = (TValue *)luaM_realloc_(L,pTVar4,(ulong)uVar6 << 4,uVar8 << 4);
      t->array = pTVar4;
    }
    pTVar4 = (TValue *)&block[(ulong)local_4c - 1].i_key;
    uVar6 = local_4c;
    do {
      if ((int)uVar6 < 1) {
        if (0 < (int)local_4c) {
          luaM_realloc_(L,block,(ulong)local_4c * 0x20,0);
        }
        return;
      }
      if (pTVar4[-1].tt_ != 0) {
        pTVar5 = luaH_set(L,t,pTVar4);
        pGVar2 = pTVar4[-1].value_.gc;
        (pTVar5->value_).gc = pGVar2;
        uVar1 = pTVar4[-1].tt_;
        pTVar5->tt_ = uVar1;
        if (((short)uVar1 < 0) &&
           (((uVar1 & 0x7f) != (ushort)pGVar2->tt ||
            ((L != (lua_State *)0x0 && ((pGVar2->marked & (L->l_G->currentwhite ^ 0x18)) != 0))))))
        {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                        ,0x1c5,"void luaH_resize(lua_State *, Table *, unsigned int, unsigned int)")
          ;
        }
      }
      uVar6 = uVar6 - 1;
      pTVar4 = pTVar4 + -2;
    } while( true );
  }
  setarrayvector(L,t,uVar6);
  luaD_throw(L,4);
}

Assistant:

void luaH_resize (lua_State *L, Table *t, unsigned int nasize,
                                          unsigned int nhsize) {
  unsigned int i;
  int j;
  AuxsetnodeT asn;
  unsigned int oldasize = t->sizearray;
  int oldhsize = allocsizenode(t);
  Node *nold = t->node;  /* save old hash ... */
  if (nasize > oldasize)  /* array part must grow? */
    setarrayvector(L, t, nasize);
  /* create new hash part with appropriate size */
  asn.t = t; asn.nhsize = nhsize;
  if (luaD_rawrunprotected(L, auxsetnode, &asn) != LUA_OK) {  /* mem. error? */
    setarrayvector(L, t, oldasize);  /* array back to its original size */
    luaD_throw(L, LUA_ERRMEM);  /* rethrow memory error */
  }
  if (nasize < oldasize) {  /* array part must shrink? */
    t->sizearray = nasize;
    /* re-insert elements from vanishing slice */
    for (i=nasize; i<oldasize; i++) {
      if (!ttisnil(&t->array[i]))
        luaH_setint(L, t, i + 1, &t->array[i]);
    }
    /* shrink array */
    luaM_reallocvector(L, t->array, oldasize, nasize, TValue);
  }
  /* re-insert elements from hash part */
  for (j = oldhsize - 1; j >= 0; j--) {
    Node *old = nold + j;
    if (!ttisnil(gval(old))) {
      /* doesn't need barrier/invalidate cache, as entry was
         already present in the table */
      setobjt2t(L, luaH_set(L, t, gkey(old)), gval(old));
    }
  }
  if (oldhsize > 0)  /* not the dummy node? */
    luaM_freearray(L, nold, cast(size_t, oldhsize)); /* free old hash */
}